

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x64SUB(uchar *stream,x86Reg dst,int num)

{
  *stream = 8 < (int)dst | 0x48;
  if ((char)(uchar)num == num) {
    stream[1] = 0x83;
    stream[2] = regCode[dst] | 0xe8;
    stream[3] = (uchar)num;
    return 4;
  }
  stream[1] = 0x81;
  stream[2] = regCode[dst] | 0xe8;
  *(int *)(stream + 3) = num;
  return 7;
}

Assistant:

unsigned encodeRex(unsigned char* stream, bool operand64Bit, x86Reg reg, x86Reg index, x86Reg base)
{
	unsigned char code = (operand64Bit ? 0x08 : 0x00) | (reg >= rR8 ? 0x04 : 0x00) | (index >= rR8 ? 0x02 : 0x00) | (base >= rR8 ? 0x01 : 0x00);

	if(code)
	{
		assert(sizeof(void*) == 8);

		*stream = 0x40 | code;
		return 1;
	}

	return 0;
}